

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Binasc.cpp
# Opt level: O3

ostream * smf::Binasc::writeBigEndianLong(ostream *out,long value)

{
  char local_1c;
  char local_1b;
  char local_1a;
  char local_19;
  
  local_1b = (char)((ulong)value >> 0x18);
  std::__ostream_insert<char,std::char_traits<char>>(out,&local_1b,1);
  local_1a = (char)((ulong)value >> 0x10);
  std::__ostream_insert<char,std::char_traits<char>>(out,&local_1a,1);
  local_1c = (char)((ulong)value >> 8);
  std::__ostream_insert<char,std::char_traits<char>>(out,&local_1c,1);
  local_19 = (char)value;
  std::__ostream_insert<char,std::char_traits<char>>(out,&local_19,1);
  return out;
}

Assistant:

std::ostream& Binasc::writeBigEndianLong(std::ostream& out, long value) {
	union { char bytes[4]; long l; } data;
	data.l = value;
	out << data.bytes[3];
	out << data.bytes[2];
	out << data.bytes[1];
	out << data.bytes[0];
	return out;

}